

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_err_t * mpca_lang_st(mpc_input_t *i,mpca_grammar_st_t *st)

{
  int iVar1;
  mpc_parser_t *pmVar2;
  mpc_parser_t *pmVar3;
  mpc_input_t *pmVar4;
  mpc_parser_t *pmVar5;
  mpc_parser_t *pmVar6;
  mpc_parser_t *pmVar7;
  mpc_parser_t *pmVar8;
  mpc_result_t *r_00;
  mpc_parser_t *p;
  mpc_parser_t *pmVar9;
  mpc_parser_t *pmVar10;
  mpc_parser_t *pmVar11;
  mpc_parser_t *pmVar12;
  mpc_parser_t *pmVar13;
  mpc_parser_t *a;
  mpc_parser_t *Base;
  mpc_parser_t *Factor;
  mpc_parser_t *Term;
  mpc_parser_t *Grammar;
  mpc_parser_t *Stmt;
  mpc_parser_t *Lang;
  mpc_err_t *e;
  mpc_result_t r;
  mpc_parser_t *in_stack_fffffffffffffec8;
  code *a_00;
  mpc_parser_t *in_stack_fffffffffffffed0;
  code *p_00;
  mpc_apply_to_t in_stack_fffffffffffffed8;
  code *f;
  mpc_parser_t *in_stack_fffffffffffffee0;
  code *a_01;
  mpc_input_t *i_00;
  mpc_err_t *local_18;
  
  pmVar2 = mpc_new((char *)in_stack_fffffffffffffed0);
  pmVar3 = mpc_new((char *)in_stack_fffffffffffffed0);
  pmVar4 = (mpc_input_t *)mpc_new((char *)in_stack_fffffffffffffed0);
  pmVar5 = mpc_new((char *)in_stack_fffffffffffffed0);
  pmVar6 = mpc_new((char *)in_stack_fffffffffffffed0);
  pmVar7 = mpc_new((char *)in_stack_fffffffffffffed0);
  mpc_many((mpc_fold_t)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  mpc_predictive(in_stack_fffffffffffffed0);
  mpc_total(in_stack_fffffffffffffed0,(mpc_dtor_t)in_stack_fffffffffffffec8);
  mpc_apply_to(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  mpc_define(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  mpc_ident();
  pmVar8 = mpc_tok(in_stack_fffffffffffffed0);
  mpc_string_lit();
  mpc_tok(in_stack_fffffffffffffed0);
  r_00 = (mpc_result_t *)mpc_maybe((mpc_parser_t *)0x29da6f);
  p = mpc_sym((char *)0x29da80);
  i_00 = pmVar4;
  pmVar9 = mpc_sym((char *)0x29da9e);
  p_00 = free;
  f = free;
  a_01 = free;
  mpc_and(5,mpca_stmt_afold,pmVar8,r_00,p,i_00);
  mpc_define((mpc_parser_t *)p_00,pmVar9);
  pmVar8 = pmVar5;
  pmVar10 = mpc_sym((char *)0x29db21);
  mpc_and(2,mpcf_snd_free,pmVar10,pmVar4,free);
  pmVar10 = mpc_maybe((mpc_parser_t *)0x29db4e);
  mpc_and(2,mpcaf_grammar_or,pmVar5,pmVar10,mpc_soft_delete);
  mpc_define((mpc_parser_t *)p_00,pmVar9);
  mpc_many1(p_00,pmVar9);
  mpc_define((mpc_parser_t *)p_00,pmVar9);
  pmVar5 = pmVar7;
  pmVar10 = mpc_sym((char *)0x29dbd7);
  pmVar11 = mpc_sym((char *)0x29dbe8);
  pmVar12 = mpc_sym((char *)0x29dbf9);
  pmVar13 = mpc_sym((char *)0x29dc0d);
  mpc_int();
  pmVar9 = mpc_tok_brackets((mpc_parser_t *)p_00,(mpc_dtor_t)pmVar9);
  a = mpc_pass();
  pmVar9 = mpc_or(6,pmVar10,pmVar11,pmVar12,pmVar13,pmVar9);
  mpc_and(2,mpcaf_grammar_repeat,pmVar7,pmVar9,mpc_soft_delete);
  mpc_define((mpc_parser_t *)p_00,a);
  mpc_string_lit();
  mpc_tok((mpc_parser_t *)p_00);
  pmVar7 = mpc_apply_to((mpc_parser_t *)a_01,f,p_00);
  mpc_char_lit();
  mpc_tok((mpc_parser_t *)p_00);
  pmVar9 = mpc_apply_to((mpc_parser_t *)a_01,f,p_00);
  pmVar10 = mpc_regex_lit();
  mpc_oneof((char *)p_00);
  pmVar11 = mpc_many(p_00,a);
  pmVar12 = mpc_lift_val(p_00);
  a_00 = free;
  mpc_and(3,mpcaf_fold_regex,pmVar10,pmVar11,pmVar12,free);
  pmVar10 = mpc_tok((mpc_parser_t *)p_00);
  pmVar11 = mpc_digits();
  pmVar12 = mpc_ident();
  mpc_or(2,pmVar11,pmVar12);
  mpc_tok_braces((mpc_parser_t *)p_00,a_00);
  pmVar11 = mpc_apply_to((mpc_parser_t *)a_01,f,p_00);
  pmVar12 = mpc_tok_parens((mpc_parser_t *)p_00,a_00);
  mpc_or(5,pmVar7,pmVar9,pmVar10,pmVar11,pmVar12);
  mpc_define((mpc_parser_t *)p_00,(mpc_parser_t *)a_00);
  mpc_optimise((mpc_parser_t *)0x29de3d);
  mpc_optimise((mpc_parser_t *)0x29de4a);
  mpc_optimise((mpc_parser_t *)0x29de57);
  mpc_optimise((mpc_parser_t *)0x29de64);
  mpc_optimise((mpc_parser_t *)0x29de71);
  mpc_optimise((mpc_parser_t *)0x29de7e);
  iVar1 = mpc_parse_input(i_00,p,r_00);
  if (iVar1 != 0) {
    local_18 = (mpc_err_t *)0x0;
  }
  mpc_cleanup(6,pmVar2,pmVar3,pmVar4,pmVar8,pmVar6,pmVar5);
  return local_18;
}

Assistant:

static mpc_err_t *mpca_lang_st(mpc_input_t *i, mpca_grammar_st_t *st) {

  mpc_result_t r;
  mpc_err_t *e;
  mpc_parser_t *Lang, *Stmt, *Grammar, *Term, *Factor, *Base;

  Lang    = mpc_new("lang");
  Stmt    = mpc_new("stmt");
  Grammar = mpc_new("grammar");
  Term    = mpc_new("term");
  Factor  = mpc_new("factor");
  Base    = mpc_new("base");

  mpc_define(Lang, mpc_apply_to(
    mpc_total(mpc_predictive(mpc_many(mpca_stmt_fold, Stmt)), mpca_stmt_list_delete),
    mpca_stmt_list_apply_to, st
  ));

  mpc_define(Stmt, mpc_and(5, mpca_stmt_afold,
    mpc_tok(mpc_ident()), mpc_maybe(mpc_tok(mpc_string_lit())), mpc_sym(":"), Grammar, mpc_sym(";"),
    free, free, free, mpc_soft_delete
  ));

  mpc_define(Grammar, mpc_and(2, mpcaf_grammar_or,
      Term,
      mpc_maybe(mpc_and(2, mpcf_snd_free, mpc_sym("|"), Grammar, free)),
      mpc_soft_delete
  ));

  mpc_define(Term, mpc_many1(mpcaf_grammar_and, Factor));

  mpc_define(Factor, mpc_and(2, mpcaf_grammar_repeat,
    Base,
      mpc_or(6,
        mpc_sym("*"),
        mpc_sym("+"),
        mpc_sym("?"),
        mpc_sym("!"),
        mpc_tok_brackets(mpc_int(), free),
        mpc_pass()),
    mpc_soft_delete
  ));

  mpc_define(Base, mpc_or(5,
    mpc_apply_to(mpc_tok(mpc_string_lit()), mpcaf_grammar_string, st),
    mpc_apply_to(mpc_tok(mpc_char_lit()),   mpcaf_grammar_char, st),
    mpc_tok(mpc_and(3, mpcaf_fold_regex, mpc_regex_lit(), mpc_many(mpcf_strfold, mpc_oneof("ms")), mpc_lift_val(st), free, free)),
    mpc_apply_to(mpc_tok_braces(mpc_or(2, mpc_digits(), mpc_ident()), free), mpcaf_grammar_id, st),
    mpc_tok_parens(Grammar, mpc_soft_delete)
  ));

  mpc_optimise(Lang);
  mpc_optimise(Stmt);
  mpc_optimise(Grammar);
  mpc_optimise(Term);
  mpc_optimise(Factor);
  mpc_optimise(Base);

  if (!mpc_parse_input(i, Lang, &r)) {
    e = r.error;
  } else {
    e = NULL;
  }

  mpc_cleanup(6, Lang, Stmt, Grammar, Term, Factor, Base);

  return e;
}